

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall CCharacter::TickPaused(CCharacter *this)

{
  int *piVar1;
  int iVar2;
  
  this->m_AttackTick = this->m_AttackTick + 1;
  piVar1 = &(this->m_Ninja).m_ActivationTick;
  *piVar1 = *piVar1 + 1;
  this->m_ReckoningTick = this->m_ReckoningTick + 1;
  if (this->m_LastAction != -1) {
    this->m_LastAction = this->m_LastAction + 1;
  }
  iVar2 = this->m_aWeapons[this->m_ActiveWeapon].m_AmmoRegenStart;
  if (-1 < iVar2) {
    this->m_aWeapons[this->m_ActiveWeapon].m_AmmoRegenStart = iVar2 + 1;
  }
  if (-1 < this->m_EmoteStop) {
    this->m_EmoteStop = this->m_EmoteStop + 1;
  }
  return;
}

Assistant:

void CCharacter::TickPaused()
{
	++m_AttackTick;
	++m_Ninja.m_ActivationTick;
	++m_ReckoningTick;
	if(m_LastAction != -1)
		++m_LastAction;
	if(m_aWeapons[m_ActiveWeapon].m_AmmoRegenStart > -1)
		++m_aWeapons[m_ActiveWeapon].m_AmmoRegenStart;
	if(m_EmoteStop > -1)
		++m_EmoteStop;
}